

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O1

uint8_t * __thiscall
cdns::dump_block_parameters
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int64_t iVar4;
  byte *in_00;
  uint8_t *in_01;
  size_t __size;
  char *__ptr;
  int iVar5;
  uint uVar6;
  int64_t inner_val;
  char *p_out;
  int64_t local_58;
  long local_50;
  uint local_48;
  undefined4 uStack_44;
  char *local_40;
  char *local_38;
  
  bVar2 = *in >> 5;
  local_38 = out_max;
  in_00 = cbor_get_number(in,in_max,&local_58);
  if (((cdns_version == 0) && (in_00 != (byte *)0x0)) && (bVar2 == 5)) {
    fwrite("[\n",2,1,(FILE *)F_out);
    iVar4 = local_58;
    if (local_58 == -1) {
      local_58 = 0xffffffff;
    }
    lVar1 = local_58;
    if ((in_00 < in_max) && (0 < local_58)) {
      local_50 = iVar4;
      iVar5 = 0;
      while (bVar2 = *in_00, bVar2 != 0xff) {
        in_01 = cbor_get_number(in_00,in_max,(int64_t *)&local_48);
        if (bVar2 < 0x20) {
          if (iVar5 != 0) {
            fwrite(",\n",2,1,(FILE *)F_out);
          }
          local_40 = out_buf;
          switch(CONCAT44(uStack_44,local_48)) {
          case 0:
            __size = 0x1c;
            __ptr = "            --query-timeout\n";
            break;
          case 1:
            __size = 0x1b;
            __ptr = "            --skew-timeout\n";
            break;
          case 2:
            __size = 0x16;
            __ptr = "            --snaplen\n";
            break;
          case 3:
            __size = 0x16;
            __ptr = "            --promisc\n";
            break;
          case 4:
            __size = 0x19;
            __ptr = "            --interfaces\n";
            break;
          case 5:
            __size = 0x1f;
            __ptr = "            --server-addresses\n";
            break;
          case 6:
            __size = 0x17;
            __ptr = "            --vlan-ids\n";
            break;
          case 7:
            __size = 0x15;
            __ptr = "            --filter\n";
            break;
          case 8:
            __size = 0x1c;
            __ptr = "            --query-options\n";
            break;
          case 9:
            __size = 0x1f;
            __ptr = "            --response-options\n";
            break;
          case 10:
            __size = 0x1e;
            __ptr = "            --accept-rr-types\n";
            break;
          case 0xb:
            __size = 0x1e;
            __ptr = "            --ignore-rr-types\n";
            break;
          case 0xc:
            __size = 0x21;
            __ptr = "            --max-block-qr-items\n";
            break;
          default:
            goto switchD_00176af0_default;
          }
          fwrite(__ptr,__size,1,(FILE *)F_out);
switchD_00176af0_default:
          iVar5 = iVar5 + 1;
          fprintf((FILE *)F_out,"            %d,",(ulong)local_48);
          in_00 = cbor_to_text(in_01,in_max,&local_40,local_38,err);
          fwrite(out_buf,1,(long)local_40 - (long)out_buf,(FILE *)F_out);
          local_58 = local_58 + -1;
        }
        else {
          fprintf((FILE *)F_out,"        Unexpected type: %d(%d)\n",(ulong)(bVar2 >> 5),
                  (ulong)local_48);
          *err = -3;
          in_00 = (byte *)0x0;
        }
        lVar1 = local_58;
        if (((in_max <= in_00) || (in_00 == (byte *)0x0)) || (local_58 < 1))
        goto joined_r0x00176e72;
      }
      fwrite("\n            --end of array",0x1b,1,(FILE *)F_out);
      if (local_50 == -1) {
        in_00 = in_00 + 1;
        lVar1 = local_58;
      }
      else {
        fwrite("            Error, end of array mark unexpected.\n",0x31,1,(FILE *)F_out);
        *err = -3;
        in_00 = (byte *)0x0;
        lVar1 = local_58;
      }
    }
  }
  else {
    if (((cdns_version != 1) || (in_00 == (byte *)0x0)) || (bVar2 != 4)) {
      fprintf((FILE *)F_out,
              "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n"
              ,(ulong)(uint)cdns_version,(ulong)bVar2);
      *err = -3;
      return (uint8_t *)0x0;
    }
    fwrite(" [\n",3,1,(FILE *)F_out);
    iVar4 = local_58;
    if (local_58 == -1) {
      local_58 = 0xffffffff;
    }
    lVar1 = local_58;
    if ((in_00 < in_max) && (0 < local_58)) {
      local_50 = iVar4;
      uVar6 = 0;
      while (*in_00 != 0xff) {
        local_40 = out_buf;
        fprintf((FILE *)F_out,"            -- Block parameter %d:\n",(ulong)uVar6);
        in_00 = dump_block_parameters_rfc(this,in_00,in_max,out_buf,local_38,err,F_out);
        lVar1 = local_58 + -1;
        if (((in_max <= in_00) || (in_00 == (byte *)0x0)) ||
           (uVar6 = uVar6 + 1, bVar3 = local_58 < 2, local_58 = lVar1, bVar3))
        goto joined_r0x00176e72;
      }
      fwrite("        --end of array",0x16,1,(FILE *)F_out);
      if (local_50 == -1) {
        in_00 = in_00 + 1;
        lVar1 = local_58;
      }
      else {
        fwrite("        Error, end of array mark unexpected.\n",0x2d,1,(FILE *)F_out);
        *err = -3;
        in_00 = (byte *)0x0;
        lVar1 = local_58;
      }
    }
  }
joined_r0x00176e72:
  local_58 = lVar1;
  if (in_00 != (byte *)0x0) {
    fwrite("\n        ]",10,1,(FILE *)F_out);
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_parameters(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in != NULL && outer_type == CBOR_T_MAP && cdns_version == 0) {
        /* Input is in draft-04 format */
        int rank = 0;
        fprintf(F_out, "[\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "        Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    {
                        /* Type definitions copies fro source code of compactor */
                        p_out = out_buf;
                        if (inner_val == 0) {
                            fprintf(F_out, "            --query-timeout\n");
                        }
                        else if (inner_val == 1) {
                            fprintf(F_out, "            --skew-timeout\n");
                        }
                        else if (inner_val == 2) {
                            fprintf(F_out, "            --snaplen\n");
                        }
                        else if (inner_val == 3) {
                            fprintf(F_out, "            --promisc\n");
                        }
                        else if (inner_val == 4) {
                            fprintf(F_out, "            --interfaces\n"); /* V0.5 only? */
                        }
                        else if (inner_val == 5) {
                            fprintf(F_out, "            --server-addresses\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 6) {
                            fprintf(F_out, "            --vlan-ids\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 7) {
                            fprintf(F_out, "            --filter\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 8) {
                            fprintf(F_out, "            --query-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 9) {
                            fprintf(F_out, "            --response-options\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 10) {
                            fprintf(F_out, "            --accept-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 11) {
                            fprintf(F_out, "            --ignore-rr-types\n"); /* v0.5 only? */
                        }
                        else if (inner_val == 12) {
                            fprintf(F_out, "            --max-block-qr-items\n"); /* v0.5 only? */
                        }
                        fprintf(F_out, "            %d,", (int)inner_val);
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }


        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else if (in != NULL && outer_type == CBOR_T_ARRAY && cdns_version == 1) {
        /* Block parameter in Array format */
        int rank = 0;

        fprintf(F_out, " [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                p_out = out_buf;
                fprintf(F_out, "            -- Block parameter %d:\n", rank);
                rank++;

                in = dump_block_parameters_rfc(in, in_max, out_buf, out_max, err, F_out);
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]");
        }
    }
    else {
        fprintf(F_out, "       Error, cannot parse the first bytes of block parameters (version %d), type %d.\n", cdns_version, outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }

    return in;
}